

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpris-core.c
# Opt level: O3

void media_player2_call_quit
               (MediaPlayer2 *proxy,GCancellable *cancellable,GAsyncReadyCallback callback,
               gpointer user_data)

{
  undefined8 uVar1;
  undefined8 uVar2;
  
  uVar1 = g_dbus_proxy_get_type();
  uVar1 = g_type_check_instance_cast(proxy,uVar1);
  uVar2 = g_variant_new("()");
  g_dbus_proxy_call(uVar1,"Quit",uVar2,0,0xffffffff,cancellable,callback,user_data);
  return;
}

Assistant:

void
media_player2_call_quit (
    MediaPlayer2 *proxy,
    GCancellable *cancellable,
    GAsyncReadyCallback callback,
    gpointer user_data)
{
  g_dbus_proxy_call (G_DBUS_PROXY (proxy),
    "Quit",
    g_variant_new ("()"),
    G_DBUS_CALL_FLAGS_NONE,
    -1,
    cancellable,
    callback,
    user_data);
}